

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::readBodyFast
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *rb)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  QArrayData *local_68;
  char *pcStack_60;
  long local_58;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*(long *)socket + 0xa0))(socket);
  lVar2 = this->bodyLength - this->contentRead;
  if (lVar1 < lVar2) {
    lVar2 = lVar1;
  }
  if (((this->readBufferMaxSize == 0) || (lVar2 < this->readBufferMaxSize)) && (lVar2 == 0)) {
    lVar2 = 0;
  }
  else {
    local_68 = (QArrayData *)0x0;
    pcStack_60 = (char *)0x0;
    local_58 = 0;
    QByteArray::resize((longlong)&local_68);
    if ((local_68 == (QArrayData *)0x0) ||
       (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_68,(AllocationOption)local_58);
    }
    lVar2 = QIODevice::read((char *)socket,(longlong)pcStack_60);
    if (lVar2 == -1) {
      QByteArray::clear();
      lVar2 = 0;
    }
    else {
      QByteArray::resize((longlong)&local_68);
      local_48.d.d = (Data *)local_68;
      local_48.d.ptr = pcStack_60;
      local_48.d.size = local_58;
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_58 != 0) {
        rb->bufferCompleteSize = rb->bufferCompleteSize + local_58;
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                  ((QMovableArrayOps<QByteArray> *)rb,(rb->buffers).d.size,&local_48);
        QList<QByteArray>::end(&rb->buffers);
      }
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      lVar1 = this->contentRead + lVar2;
      if (lVar1 == this->bodyLength) {
        this->state = AllDoneState;
      }
      this->contentRead = lVar1;
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar2;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readBodyFast(QIODevice *socket, QByteDataBuffer *rb)
{

    qint64 toBeRead = qMin(socket->bytesAvailable(), bodyLength - contentRead);
    if (readBufferMaxSize)
        toBeRead = qMin(toBeRead, readBufferMaxSize);

    if (!toBeRead)
        return 0;

    QByteArray bd;
    bd.resize(toBeRead);
    qint64 haveRead = socket->read(bd.data(), toBeRead);
    if (haveRead == -1) {
        bd.clear();
        return 0; // ### error checking here;
    }
    bd.resize(haveRead);

    rb->append(bd);

    if (contentRead + haveRead == bodyLength) {
        state = AllDoneState;
    }

    contentRead += haveRead;
    return haveRead;
}